

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O0

mz_bool mz_zip_writer_init_from_reader(mz_zip_archive *pZip,char *pFilename)

{
  FILE *pFVar1;
  long in_RSI;
  long *in_RDI;
  mz_zip_internal_state *pState;
  mz_zip_archive *in_stack_ffffffffffffffd8;
  char *pPath;
  mz_bool local_4;
  
  if (((in_RDI == (long *)0x0) || (in_RDI[0xb] == 0)) || (*(int *)((long)in_RDI + 0x14) != 1)) {
    local_4 = 0;
  }
  else if (((int)in_RDI[2] == 0xffff) || (0xffffffff < *in_RDI + 0x4cU)) {
    local_4 = 0;
  }
  else {
    pPath = (char *)in_RDI[0xb];
    if (*(long *)(pPath + 0x60) == 0) {
      if (*(long *)(pPath + 0x68) == 0) {
        if (in_RDI[9] == 0) {
          return 0;
        }
      }
      else {
        if ((long *)in_RDI[10] != in_RDI) {
          return 0;
        }
        *(undefined8 *)(pPath + 0x78) = *(undefined8 *)(pPath + 0x70);
        in_RDI[9] = (long)mz_zip_heap_write_func;
      }
    }
    else {
      if ((long *)in_RDI[10] != in_RDI) {
        return 0;
      }
      if (in_RSI == 0) {
        return 0;
      }
      in_RDI[9] = (long)mz_zip_file_write_func;
      pFVar1 = mz_freopen(pPath,(char *)in_stack_ffffffffffffffd8,(FILE *)0x1604b9);
      *(FILE **)(pPath + 0x60) = pFVar1;
      if (pFVar1 == (FILE *)0x0) {
        mz_zip_reader_end(in_stack_ffffffffffffffd8);
        return 0;
      }
    }
    *in_RDI = in_RDI[1];
    *(undefined4 *)((long)in_RDI + 0x14) = 2;
    in_RDI[1] = 0;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

mz_bool mz_zip_writer_init_from_reader(mz_zip_archive* pZip, const char* pFilename) {
  mz_zip_internal_state* pState;
  if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING))
    return MZ_FALSE;
  // No sense in trying to write to an archive that's already at the support max size
  if ((pZip->m_total_files == 0xFFFF) || ((pZip->m_archive_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_ZIP_LOCAL_DIR_HEADER_SIZE) > 0xFFFFFFFF))
    return MZ_FALSE;

  pState = pZip->m_pState;

  if (pState->m_pFile) {
#ifdef MINIZ_NO_STDIO
    pFilename;
    return MZ_FALSE;
#else
    // Archive is being read from stdio - try to reopen as writable.
    if (pZip->m_pIO_opaque != pZip)
      return MZ_FALSE;
    if (!pFilename)
      return MZ_FALSE;
    pZip->m_pWrite = mz_zip_file_write_func;
    if (NULL == (pState->m_pFile = MZ_FREOPEN(pFilename, "r+b", pState->m_pFile))) {
      // The mz_zip_archive is now in a bogus state because pState->m_pFile is NULL, so just close it.
      mz_zip_reader_end(pZip);
      return MZ_FALSE;
    }
#endif  // #ifdef MINIZ_NO_STDIO
  } else if (pState->m_pMem) {
    // Archive lives in a memory block. Assume it's from the heap that we can resize using the realloc callback.
    if (pZip->m_pIO_opaque != pZip)
      return MZ_FALSE;
    pState->m_mem_capacity = pState->m_mem_size;
    pZip->m_pWrite = mz_zip_heap_write_func;
  }
  // Archive is being read via a user provided read function - make sure the user has specified a write function too.
  else if (!pZip->m_pWrite)
    return MZ_FALSE;

  // Start writing new files at the archive's current central directory location.
  pZip->m_archive_size = pZip->m_central_directory_file_ofs;
  pZip->m_zip_mode = MZ_ZIP_MODE_WRITING;
  pZip->m_central_directory_file_ofs = 0;

  return MZ_TRUE;
}